

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v10::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,bool value)

{
  appender aVar1;
  locale_ref in_R8;
  undefined1 local_48 [8];
  format_specs<char> local_40;
  buffer<char> *local_30;
  undefined1 local_21;
  default_arg_formatter<char> *pdStack_20;
  bool value_local;
  default_arg_formatter<char> *this_local;
  undefined1 *local_10;
  
  local_30 = (this->out).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_21 = value;
  pdStack_20 = this;
  format_specs<char>::format_specs(&local_40);
  local_10 = local_48;
  aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
  aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ = value;
  aVar1 = write<char,_fmt::v10::appender,_bool,_0>
                    ((detail *)local_30,aVar1,SUB81(&local_40,0),(format_specs<char> *)0x0,in_R8);
  return (iterator)
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }